

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O2

void quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>
               (teamscore *start,teamscore *end,_func_bool_teamscore_ptr_teamscore_ptr *fun)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  teamscore *ptVar5;
  teamscore *end_00;
  teamscore *ptVar6;
  teamscore *ptVar7;
  teamscore *ptVar8;
  teamscore pivot;
  teamscore tmp;
  teamscore local_58;
  teamscore local_48;
  teamscore *local_38;
  
  do {
    uVar4 = (long)end - (long)start >> 4;
    local_38 = end;
    if ((long)uVar4 < 0xb) {
      ptVar8 = start;
      do {
        do {
          ptVar6 = ptVar8;
          ptVar8 = ptVar6 + 1;
          if (local_38 <= ptVar8) {
            return;
          }
          bVar2 = (*fun)(ptVar8,ptVar6);
        } while (!bVar2);
        local_48.team._0_4_ = *(undefined4 *)&ptVar8->team;
        local_48.team._4_4_ = *(undefined4 *)((long)&ptVar6[1].team + 4);
        local_48.score = ptVar6[1].score;
        local_48._12_4_ = *(undefined4 *)&ptVar6[1].field_0xc;
        ptVar6[1].score = ptVar6->score;
        ptVar8->team = ptVar6->team;
        while (start < ptVar6) {
          ptVar7 = ptVar6 + -1;
          bVar2 = (*fun)(&local_48,ptVar7);
          if (!bVar2) break;
          ptVar6->score = ptVar6[-1].score;
          ptVar6->team = ptVar7->team;
          ptVar6 = ptVar7;
        }
        ptVar6->score = local_48.score;
        ptVar6->team = (char *)CONCAT44(local_48.team._4_4_,local_48.team._0_4_);
      } while( true );
    }
    ptVar6 = (teamscore *)(&start->team + (uVar4 & 0xfffffffffffffffe));
    bVar2 = (*fun)(start,ptVar6);
    ptVar8 = end + -1;
    if (bVar2) {
      bVar2 = (*fun)(ptVar8,start);
      if (bVar2) {
        local_58.score = start->score;
        local_58.team = start->team;
        start->score = end[-1].score;
        start->team = ptVar8->team;
        end[-1].score = ptVar6->score;
        ptVar8->team = ptVar6->team;
      }
      else {
        bVar2 = (*fun)(ptVar8,ptVar6);
        if (bVar2) {
          local_58.score = end[-1].score;
          local_58.team = ptVar8->team;
          ptVar8->team = ptVar6->team;
          iVar3 = ptVar6->score;
LAB_0014115c:
          end[-1].score = iVar3;
        }
        else {
          local_58.score = ptVar6->score;
          local_58.team = ptVar6->team;
        }
      }
    }
    else {
      bVar2 = (*fun)(start,ptVar8);
      if (bVar2) {
        local_58.score = start->score;
        local_58.team = start->team;
        start->team = ptVar6->team;
        start->score = ptVar6->score;
      }
      else {
        bVar2 = (*fun)(ptVar6,ptVar8);
        if (!bVar2) {
          local_58.score = ptVar6->score;
          local_58.team = ptVar6->team;
          local_48.team._0_4_ = *(undefined4 *)&start->team;
          local_48.team._4_4_ = *(undefined4 *)((long)&start->team + 4);
          pcVar1 = start->team;
          iVar3 = start->score;
          local_48._12_4_ = *(undefined4 *)&start->field_0xc;
          start->score = end[-1].score;
          start->team = ptVar8->team;
          ptVar8->team = pcVar1;
          local_48.score = iVar3;
          goto LAB_0014115c;
        }
        local_58.score = end[-1].score;
        local_58.team = ptVar8->team;
        end[-1].score = start->score;
        ptVar8->team = start->team;
        start->score = ptVar6->score;
        start->team = ptVar6->team;
      }
    }
    ptVar7 = end + -2;
    ptVar6->score = end[-2].score;
    ptVar6->team = ptVar7->team;
    ptVar8 = start + 1;
    ptVar6 = ptVar7;
    do {
      while (end_00 = ptVar8, bVar2 = (*fun)(end_00,&local_58), bVar2) {
        end_00 = end_00 + 1;
        ptVar8 = end_00;
        if (ptVar6 <= end_00) goto LAB_001411e7;
      }
      while( true ) {
        ptVar5 = ptVar6 + -1;
        bVar2 = (*fun)(&local_58,ptVar5);
        if (!bVar2) break;
        ptVar6 = ptVar5;
        if (ptVar5 <= end_00) goto LAB_001411e7;
      }
      local_48.team._0_4_ = *(undefined4 *)&end_00->team;
      local_48.team._4_4_ = *(undefined4 *)((long)&end_00->team + 4);
      pcVar1 = end_00->team;
      local_48.score = end_00->score;
      local_48._12_4_ = *(undefined4 *)&end_00->field_0xc;
      end_00->score = ptVar6[-1].score;
      end_00->team = ptVar5->team;
      ptVar5->team = pcVar1;
      ptVar6[-1].score = local_48.score;
      ptVar8 = end_00 + 1;
      ptVar6 = ptVar5;
    } while (end_00 + 1 < ptVar5);
    end_00 = end_00 + 1;
LAB_001411e7:
    ptVar6 = local_38;
    end[-2].score = end_00->score;
    ptVar7->team = end_00->team;
    end_00->team = local_58.team;
    end_00->score = local_58.score;
    ptVar8 = end_00 + 1;
    if ((long)end_00 - (long)start < (long)local_38 - (long)ptVar8) {
      quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>(start,end_00,fun);
      start = ptVar8;
      end = ptVar6;
    }
    else {
      quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>(ptVar8,local_38,fun);
      end = end_00;
    }
  } while( true );
}

Assistant:

static inline void quicksort(T *start, T *end, F fun)
{
    while(end-start > 10)
    {
        T *mid = &start[(end-start)/2], *i = start+1, *j = end-2, pivot;
        if(fun(*start, *mid)) /* start < mid */
        {
            if(fun(end[-1], *start)) { pivot = *start; *start = end[-1]; end[-1] = *mid; } /* end < start < mid */
            else if(fun(end[-1], *mid)) { pivot = end[-1]; end[-1] = *mid; } /* start <= end < mid */
            else { pivot = *mid; } /* start < mid <= end */
        }
        else if(fun(*start, end[-1])) { pivot = *start; *start = *mid; } /*mid <= start < end */
        else if(fun(*mid, end[-1])) { pivot = end[-1]; end[-1] = *start; *start = *mid; } /* mid < end <= start */
        else { pivot = *mid; swap(*start, end[-1]); }  /* end <= mid <= start */
        *mid = end[-2];
        do
        {
            while(fun(*i, pivot)) if(++i >= j) goto partitioned;
            while(fun(pivot, *--j)) if(i >= j) goto partitioned;
            swap(*i, *j);
        }
        while(++i < j);
    partitioned:
        end[-2] = *i;
        *i = pivot;
        
        if(i-start < end-(i+1))
        {
            quicksort(start, i, fun);
            start = i+1;
        }
        else
        {
            quicksort(i+1, end, fun);
            end = i;
        }
    }
    
    insertionsort(start, end, fun);
}